

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc_base_func.cpp
# Opt level: O2

uint32_t ivk::cmd_fopen(void *el)

{
  uint32_t uVar1;
  char *pcVar2;
  char *pcVar3;
  char *__filename;
  FILE *dt_00;
  char *hd;
  proc_data dt;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>
  local_50;
  
  pcVar2 = get_attr_val((XMLElement **)el,"handle");
  hd = pcVar2;
  pcVar3 = get_attr_val((XMLElement **)el,"mode");
  __filename = get_attr_val((XMLElement **)el,"file");
  if (__filename == (char *)0x0 || pcVar2 == (char *)0x0) {
    uVar1 = 5;
  }
  else {
    pcVar2 = "wr";
    if (pcVar3 != (char *)0x0) {
      pcVar2 = pcVar3;
    }
    dt_00 = fopen(__filename,pcVar2);
    proc_data::proc_data(&dt,(char *)dt_00,8,false);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>
    ::pair<const_char_*&,_ivk::proc_data_&,_true>(&local_50,&hd,&dt);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ivk::proc_data>,std::_Select1st<std::pair<std::__cxx11::string_const,ivk::proc_data>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ivk::proc_data>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,ivk::proc_data>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ivk::proc_data>,std::_Select1st<std::pair<std::__cxx11::string_const,ivk::proc_data>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ivk::proc_data>>>
                *)gCmdMemMap_abi_cxx11_,&local_50);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>
    ::~pair(&local_50);
    proc_data::~proc_data(&dt);
    uVar1 = 0;
  }
  return uVar1;
}

Assistant:

uint32_t ivk::cmd_fopen(void* el){
    XMLElement** ep = (XMLElement**)el;
    XMLElement* e = *(XMLElement**)el;

    const char* hd = get_attr_val(ep,"handle");
    const char* md = get_attr_val(ep,"mode");
    const char* fn = get_attr_val(ep,"file");
    if(!hd || !fn){
        return proc_xml_err;
    }

    FILE* f = fopen(fn, md?md:"wr");
    proc_data dt((char*)f, sizeof(FILE*), false);
    gCmdMemMap.insert(pair<string,proc_data>(hd,dt));

    return proc_success;
}